

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionInfo.cpp
# Opt level: O1

void __thiscall chrono::collision::ChCollisionInfo::SwapModels(ChCollisionInfo *this)

{
  double dVar1;
  ChCollisionModel *pCVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  pCVar2 = this->modelA;
  this->modelA = this->modelB;
  this->modelB = pCVar2;
  dVar1 = (this->vpA).m_data[0];
  dVar6 = (this->vpA).m_data[1];
  dVar7 = (this->vpA).m_data[2];
  (this->vpA).m_data[0] = (this->vpB).m_data[0];
  dVar8 = (this->vpB).m_data[2];
  (this->vpA).m_data[1] = (this->vpB).m_data[1];
  (this->vpA).m_data[2] = dVar8;
  (this->vpB).m_data[0] = dVar1;
  (this->vpB).m_data[1] = dVar6;
  (this->vpB).m_data[2] = dVar7;
  auVar9._0_8_ = -(this->vN).m_data[2];
  auVar9._8_4_ = 0;
  auVar9._12_4_ = 0x80000000;
  uVar3 = *(uint *)((long)(this->vN).m_data + 4);
  uVar4 = *(undefined4 *)((this->vN).m_data + 1);
  uVar5 = *(uint *)((long)(this->vN).m_data + 0xc);
  *(undefined4 *)(this->vN).m_data = *(undefined4 *)(this->vN).m_data;
  *(uint *)((long)(this->vN).m_data + 4) = uVar3 ^ 0x80000000;
  *(undefined4 *)((this->vN).m_data + 1) = uVar4;
  *(uint *)((long)(this->vN).m_data + 0xc) = uVar5 ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar9);
  (this->vN).m_data[2] = dVar1;
  return;
}

Assistant:

void ChCollisionInfo::SwapModels() {
    ChCollisionModel* modeltemp;
    modeltemp = modelA;
    modelA = modelB;
    modelB = modeltemp;
    ChVector<> vtemp;
    vtemp = vpA;
    vpA = vpB;
    vpB = vtemp;
    vN = Vmul(vN, -1.0);
}